

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

char * __thiscall CProficiencies::GetSkillLevelName(CProficiencies *this,int ind)

{
  int iVar1;
  string_view fmt;
  int *args;
  size_type sVar2;
  const_reference pvVar3;
  int in_ESI;
  size_t in_RDI;
  int i;
  size_type prof_level_table_size;
  int slevel;
  size_t profs_size;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar4;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe8;
  size_t sVar5;
  char *in_stack_fffffffffffffff8;
  char *pcVar6;
  
  sVar5 = in_RDI;
  args = (int *)std::size<int,25ul>((int (*) [25])(in_RDI + 0x14));
  if ((in_ESI < 0) || ((long)args - 1U < (ulong)(long)in_ESI)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    fmt._M_str = in_stack_fffffffffffffff8;
    fmt._M_len = sVar5;
    CLogger::Warn<int&>((CLogger *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),fmt,args);
    pcVar6 = "";
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x14 + (long)in_ESI * 4);
    sVar2 = std::size<std::vector<prof_level_type,std::allocator<prof_level_type>>>
                      ((vector<prof_level_type,_std::allocator<prof_level_type>_> *)0x7ab8e1);
    iVar4 = (int)sVar2;
    do {
      iVar4 = iVar4 + -1;
      if (iVar4 < 0) {
        pvVar3 = std::vector<prof_level_type,_std::allocator<prof_level_type>_>::operator[]
                           (&prof_level_table,0);
        return pvVar3->name;
      }
      pvVar3 = std::vector<prof_level_type,_std::allocator<prof_level_type>_>::operator[]
                         (&prof_level_table,(long)iVar4);
    } while (iVar1 < pvVar3->level);
    pvVar3 = std::vector<prof_level_type,_std::allocator<prof_level_type>_>::operator[]
                       (&prof_level_table,(long)iVar4);
    pcVar6 = pvVar3->name;
  }
  return pcVar6;
}

Assistant:

const char* CProficiencies::GetSkillLevelName(int ind)
{
	auto profs_size = std::size(profs);
	if(ind < 0 || ind > profs_size - 1)
	{
		RS.Logger.Warn("CProficiencies::GetSkillLevelName : index out of bounds [{}]", ind);
		return "";
	}

	auto slevel = profs[ind];
	auto prof_level_table_size = std::size(prof_level_table);
	for (int i = prof_level_table_size - 1; i >= 0; i--)
	{
		if (prof_level_table[i].level <= slevel)
			return prof_level_table[i].name;
	}

	return prof_level_table[0].name;
}